

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Engine.cpp
# Opt level: O1

StepStatus __thiscall adios2::Engine::BeginStep(Engine *this,StepMode mode,float timeoutSeconds)

{
  Engine *pointer;
  StepStatus SVar1;
  string local_48;
  
  pointer = this->m_Engine;
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,"in call to Engine::BeginStep(const StepMode, const float)","");
  helper::CheckForNullptr<adios2::core::Engine>(pointer,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  SVar1 = (**(code **)(*(long *)this->m_Engine + 0x18))(timeoutSeconds,this->m_Engine,mode);
  return SVar1;
}

Assistant:

StepStatus Engine::BeginStep(const StepMode mode, const float timeoutSeconds)
{
    helper::CheckForNullptr(m_Engine, "in call to Engine::BeginStep(const StepMode, const float)");
    return m_Engine->BeginStep(mode, timeoutSeconds);
}